

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_NURBS_CURVE
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  bool local_2a;
  byte local_29;
  bool bHaveMat;
  ON_NurbsCurve *pOStack_28;
  bool rc;
  ON_NurbsCurve *curve;
  ON_3dmObjectAttributes *pAttributes_local;
  ON_Object **ppObject_local;
  ON_BinaryArchive *this_local;
  
  pOStack_28 = (ON_NurbsCurve *)0x0;
  local_29 = 0;
  local_2a = false;
  curve = (ON_NurbsCurve *)pAttributes;
  pAttributes_local = (ON_3dmObjectAttributes *)ppObject;
  ppObject_local = (ON_Object **)this;
  pOStack_28 = ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA(this);
  if (pOStack_28 != (ON_NurbsCurve *)0x0) {
    (pAttributes_local->super_ON_Object)._vptr_ON_Object = (_func_int **)pOStack_28;
    local_29 = 1;
    Read3dmV1AttributesOrMaterial
              (this,(ON_3dmObjectAttributes *)curve,(ON_Material *)0x0,&local_2a,0x2ffff,
               (ON__3dmV1_XDATA *)0x0);
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_NURBS_CURVE(
  ON_Object** ppObject,
  ON_3dmObjectAttributes* pAttributes
  )
{
  // read contents of ReadV1_TCODE_RHINOIO_OBJECT_NURBS_CURVE chunk
  // written by v1 RhinoIO toolkit
  ON_NurbsCurve* curve = 0;
  bool rc = false;
  bool bHaveMat = false;
  
  // reads TCODE_RHINOIO_OBJECT_DATA header and nurbs curve definition
  curve = ReadV1_RHINOIO_NURBS_CURVE_OBJECT_DATA(*this);

  if ( curve ) {
    *ppObject = curve;
    rc = true;
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_RHINOIO_OBJECT_END);
  }

  return rc;
}